

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  size_type sVar2;
  int iVar3;
  pointer pcVar4;
  undefined8 uVar5;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  int extraout_EDX;
  pointer pcVar6;
  long lVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  allocator local_209;
  bool outputFlags [8];
  string subfolder;
  string local_1e0;
  undefined8 local_1c0;
  string local_1b8;
  FILE *fout [8];
  sigaction sa;
  string local_b8;
  string local_98;
  string parquetOutFiles [2];
  
  fout[6] = (FILE *)0x0;
  fout[7] = (FILE *)0x0;
  fout[4] = (FILE *)0x0;
  fout[5] = (FILE *)0x0;
  fout[2] = (FILE *)0x0;
  fout[3] = (FILE *)0x0;
  fout[0] = (FILE *)0x0;
  fout[1] = (FILE *)0x0;
  outputFlags[0] = false;
  outputFlags[1] = false;
  outputFlags[2] = false;
  outputFlags[3] = false;
  outputFlags[4] = false;
  outputFlags[5] = false;
  outputFlags[6] = false;
  outputFlags[7] = false;
  parquetOutFiles[0]._M_dataplus._M_p = (pointer)&parquetOutFiles[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)parquetOutFiles,"");
  paVar8 = &parquetOutFiles[1].field_2;
  parquetOutFiles[1]._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(parquetOutFiles + 1),"");
  subfolder._M_dataplus._M_p = (pointer)&subfolder.field_2;
  subfolder._M_string_length = 0;
  subfolder.field_2._M_local_buf[0] = '\0';
  local_1c0 = 0;
  pcVar4 = (pointer)0x0;
switchD_001102c3_caseD_48:
  do {
    pcVar6 = (pointer)((ulong)pcVar4 & 0xffffffff);
    iVar3 = getopt(argc,argv,"vhrHF:W:M:S:K:f:w:s:m:");
    sVar2 = subfolder._M_string_length;
    pcVar1 = _optarg;
    if (0x56 < iVar3) {
      if (iVar3 < 0x6d) {
        if (iVar3 == 0x57) {
          std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1e0);
          openpipe(1,(string *)&sa,fout);
          if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
            operator_delete(sa.__sigaction_handler.sa_handler);
          }
          outputFlags[1] = true;
          pcVar4 = pcVar6;
        }
        else {
          if (iVar3 != 0x66) {
            if (iVar3 == 0x68) {
              main_cold_1();
            }
            goto switchD_0011024a_caseD_6e;
          }
          std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1e0);
          openpipe(4,(string *)&sa,fout);
          if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
            operator_delete(sa.__sigaction_handler.sa_handler);
          }
          outputFlags[4] = true;
          pcVar4 = pcVar6;
        }
      }
      else {
        if (10 < iVar3 - 0x6dU) goto switchD_0011024a_caseD_6e;
        switch(iVar3) {
        case 0x6d:
          std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1e0);
          openpipe(7,(string *)&sa,fout);
          if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
            operator_delete(sa.__sigaction_handler.sa_handler);
          }
          outputFlags[7] = true;
          pcVar4 = pcVar6;
          break;
        default:
          goto switchD_0011024a_caseD_6e;
        case 0x72:
          local_1c0 = CONCAT71((int7)((ulong)((long)&switchD_0011024a::switchdataD_001117bc +
                                             (long)(int)(&switchD_0011024a::switchdataD_001117bc)
                                                        [iVar3 - 0x6dU]) >> 8),1);
          pcVar4 = pcVar6;
          break;
        case 0x73:
          std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1e0);
          openpipe(6,(string *)&sa,fout);
          if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
            operator_delete(sa.__sigaction_handler.sa_handler);
          }
          outputFlags[6] = true;
          pcVar4 = pcVar6;
          break;
        case 0x76:
          goto switchD_0011024a_caseD_76;
        case 0x77:
          std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1e0);
          openpipe(5,(string *)&sa,fout);
          if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
            operator_delete(sa.__sigaction_handler.sa_handler);
          }
          outputFlags[5] = true;
          pcVar4 = pcVar6;
        }
      }
      goto switchD_001102c3_caseD_48;
    }
    if (iVar3 - 0x46U < 8) {
      pcVar4 = (pointer)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
      switch(iVar3) {
      case 0x46:
        std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1e0);
        openpipe(0,(string *)&sa,fout);
        if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
          operator_delete(sa.__sigaction_handler.sa_handler);
        }
        outputFlags[0] = true;
        pcVar4 = pcVar6;
        break;
      default:
switchD_0011024a_caseD_6e:
        main_cold_5();
switchD_0011024a_caseD_76:
        main_cold_2();
        if (local_1b8._M_dataplus._M_p != "vhrHF:W:M:S:K:f:w:s:m:") {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        if (local_1e0._M_dataplus._M_p != (pointer)(ulong)(uint)argc) {
          operator_delete(local_1e0._M_dataplus._M_p);
        }
        if (extraout_EDX == 1) {
          main_cold_4();
          uVar5 = extraout_RAX_00;
          if (parquetOutFiles[0]._M_dataplus._M_p != pcVar6) {
            operator_delete(parquetOutFiles[0]._M_dataplus._M_p);
          }
        }
        else {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subfolder._M_dataplus._M_p != &subfolder.field_2) {
            operator_delete(subfolder._M_dataplus._M_p);
          }
          lVar7 = -0x40;
          do {
            pcVar4 = (((string *)(paVar8 + -1))->_M_dataplus)._M_p;
            if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar4) {
              operator_delete(pcVar4);
            }
            paVar8 = paVar8 + -2;
            lVar7 = lVar7 + 0x20;
            uVar5 = extraout_RAX;
          } while (lVar7 != 0);
        }
        _Unwind_Resume(uVar5);
      case 0x48:
        break;
      case 0x4b:
        strlen(_optarg);
        uVar5 = std::__cxx11::string::_M_replace((ulong)&subfolder,0,(char *)sVar2,(ulong)pcVar1);
        pcVar4 = (pointer)CONCAT71((int7)((ulong)uVar5 >> 8),(char)pcVar6);
        break;
      case 0x4d:
        std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1e0);
        openpipe(3,(string *)&sa,fout);
        if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
          operator_delete(sa.__sigaction_handler.sa_handler);
        }
        outputFlags[3] = true;
        pcVar4 = pcVar6;
      }
    }
    else {
      if (iVar3 != 0x53) {
        if (iVar3 == -1) {
          if (argc == 1) {
            main_cold_3();
          }
          progname = *argv;
          memset(&sa,0,0x98);
          sigemptyset((sigset_t *)&sa.sa_mask);
          sa.__sigaction_handler.sa_handler = segfault_sigaction;
          sa.sa_flags = 4;
          sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
          initstreams(&local_98,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          std::__cxx11::string::string((string *)&local_1e0,progname,&local_209);
          paVar8 = &local_1b8.field_2;
          local_1b8._M_dataplus._M_p = (pointer)paVar8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"INFO","");
          logprintf(&local_1e0,&local_1b8,"starting process..\n");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != paVar8) {
            operator_delete(local_1b8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p);
          }
          leccalc::doit(&subfolder,fout,(bool)((byte)local_1c0 & 1),SUB81(pcVar4,0),outputFlags,
                        false,parquetOutFiles,progname);
          std::__cxx11::string::string((string *)&local_1e0,progname,&local_209);
          local_1b8._M_dataplus._M_p = (pointer)paVar8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"INFO","");
          logprintf(&local_1e0,&local_1b8,"finishing process..\n");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != paVar8) {
            operator_delete(local_1b8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subfolder._M_dataplus._M_p != &subfolder.field_2) {
            operator_delete(subfolder._M_dataplus._M_p);
          }
          lVar7 = 0;
          do {
            pcVar1 = *(char **)((long)&parquetOutFiles[1]._M_dataplus._M_p + lVar7);
            if (parquetOutFiles[1].field_2._M_local_buf + lVar7 != pcVar1) {
              operator_delete(pcVar1);
            }
            lVar7 = lVar7 + -0x20;
          } while (lVar7 != -0x40);
          return 0;
        }
        goto switchD_0011024a_caseD_6e;
      }
      std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1e0);
      openpipe(2,(string *)&sa,fout);
      if (sa.__sigaction_handler.sa_handler != (__sighandler_t)(sa.sa_mask.__val + 1)) {
        operator_delete(sa.__sigaction_handler.sa_handler);
      }
      outputFlags[2] = true;
      pcVar4 = pcVar6;
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
	bool useReturnPeriodFile = false;
	FILE* fout[] = { nullptr,nullptr,nullptr,nullptr,nullptr,nullptr,nullptr,nullptr };
	bool outputFlags[8] = { false, false, false, false,
				false, false, false, false };
	const bool ordFlag = false;   // Turn off ORD output
	const std::string parquetOutFiles[2] = { "", "" };

	std::string subfolder;
	int opt;
	bool skipheader = false;
	while ((opt = getopt(argc, argv, "vhrHF:W:M:S:K:f:w:s:m:")) != -1) {
		switch (opt) {
		case 'K':
			subfolder = optarg;
			break;
		case 'H':
			skipheader = true;
			break;
		case 'F':
			openpipe(AGG_FULL_UNCERTAINTY, optarg, fout);
			outputFlags[AGG_FULL_UNCERTAINTY] = true;
			break;
		case 'f':
			openpipe(OCC_FULL_UNCERTAINTY, optarg, fout);
			outputFlags[OCC_FULL_UNCERTAINTY] = true;
			break;
		case 'W':
			openpipe(AGG_WHEATSHEAF, optarg, fout);
			outputFlags[AGG_WHEATSHEAF] = true;
			break;
		case 'w':
			openpipe(OCC_WHEATSHEAF, optarg, fout);
			outputFlags[OCC_WHEATSHEAF] = true;
			break;
		case 'S':
			openpipe(AGG_SAMPLE_MEAN, optarg, fout);
			outputFlags[AGG_SAMPLE_MEAN] = true;
			break;
		case 's':
			openpipe(OCC_SAMPLE_MEAN, optarg, fout);
			outputFlags[OCC_SAMPLE_MEAN] = true;
			break;
		case 'M':
			openpipe(AGG_WHEATSHEAF_MEAN, optarg, fout);
			outputFlags[AGG_WHEATSHEAF_MEAN] = true;
			break;
		case 'm':
			openpipe(OCC_WHEATSHEAF_MEAN, optarg, fout);
			outputFlags[OCC_WHEATSHEAF_MEAN] = true;
			break;
		case 'r':
			useReturnPeriodFile = true;
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'h':
			help();
			::exit(EXIT_FAILURE);
			break;
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}

	if (argc == 1) {
		fprintf(stderr, "FATAL: Invalid parameters\n");
		help();
	}

	progname = argv[0];
#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	try {
		initstreams();
        	logprintf(progname, "INFO", "starting process..\n");
		leccalc::doit(subfolder, fout, useReturnPeriodFile, skipheader,
			      outputFlags, ordFlag, parquetOutFiles, progname);
        	logprintf(progname, "INFO", "finishing process..\n");
		return EXIT_SUCCESS;
	}catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}
	
}